

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf_v3::bone_motion_io::import(bone_motion_io *this,xr_reader *r,uint_fast32_t num_keys)

{
  ogf_key_qr *value;
  _vector3<float> *value_00;
  float local_3c;
  ulong uStack_28;
  float time;
  uint_fast32_t i;
  uint_fast32_t num_keys_local;
  xr_reader *r_local;
  bone_motion_io *this_local;
  
  xr_bone_motion::create_envelopes((xr_bone_motion *)this);
  for (uStack_28 = 0; uStack_28 != num_keys; uStack_28 = uStack_28 + 1) {
    local_3c = (float)uStack_28;
    value = xr_reader::skip<xray_re::ogf_key_qr>(r,1);
    xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,local_3c / 30.0,value);
    value_00 = xr_reader::skip<xray_re::_vector3<float>>(r,1);
    xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,local_3c / 30.0,value_00);
  }
  return;
}

Assistant:

inline void xr_ogf_v3::bone_motion_io::import(xr_reader& r, uint_fast32_t num_keys)
{
	create_envelopes();
	for (uint_fast32_t i = 0; i != num_keys; ++i) {
		float time = float(i)/OGF3_MOTION_FPS;
		insert_key(time, r.skip<ogf_key_qr>());
		insert_key(time, r.skip<fvector3>());
	}
}